

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void get_type_alias_name(c2m_ctx_t c2m_ctx,type *type,VARR_char *name)

{
  gen_ctx_conflict *pgVar1;
  node_t pnVar2;
  void *pvVar3;
  byte *pbVar4;
  bool bVar5;
  byte obj;
  basic_type bVar6;
  size_t sVar7;
  node_t_conflict pnVar8;
  decl_spec *pdVar9;
  ulong uVar10;
  anon_union_16_10_0af5b411_for_u *paVar11;
  anon_union_8_5_3fbb1736_for_u *paVar12;
  
  do {
    switch(type->mode) {
    case TM_BASIC:
      bVar6 = (type->u).basic_type;
LAB_001776c6:
      if (0xf < bVar6 - TP_VOID) {
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2874,"void get_type_alias_name(c2m_ctx_t, struct type *, VARR_char *)");
      }
      obj = (&DAT_001897d0)[bVar6 - TP_VOID];
LAB_0017773e:
      VARR_charpush(name,obj);
      return;
    case TM_ENUM:
      bVar6 = get_enum_basic_type(type);
      goto LAB_001776c6;
    case TM_PTR:
      VARR_charpush(name,'p');
      paVar12 = &type->u;
      break;
    case TM_STRUCT:
    case TM_UNION:
      pgVar1 = c2m_ctx->gen_ctx;
      VARR_charpush(name,(type->mode != TM_STRUCT) * '\x02' + 'S');
      uVar10 = 0;
      while ((sVar7 = VARR_node_tlength(pgVar1->node_stack), uVar10 < sVar7 &&
             (pnVar8 = VARR_node_tget(pgVar1->node_stack,uVar10), pnVar8 != (type->u).tag_type))) {
        uVar10 = uVar10 + 1;
      }
      sVar7 = VARR_node_tlength(pgVar1->node_stack);
      if (uVar10 < sVar7) {
        VARR_charpush(name,'r');
        push_val(name,uVar10);
      }
      else {
        VARR_node_tpush(pgVar1->node_stack,(type->u).tag_type);
        pnVar8 = DLIST_node_t_el(&(((type->u).tag_type)->u).ops,1);
        paVar11 = &pnVar8->u;
        while (pnVar2 = (paVar11->ops).head, pnVar2 != (node_t)0x0) {
          if (pnVar2->code == N_MEMBER) {
            pvVar3 = pnVar2->attr;
            pnVar8 = DLIST_node_t_el(&(pnVar2->u).ops,3);
            get_type_alias_name(c2m_ctx,*(type **)((long)pvVar3 + 0x40),name);
            if ((pnVar8->code != N_IGNORE) && (pbVar4 = (byte *)pnVar8->attr, (*pbVar4 & 1) != 0)) {
              VARR_charpush(name,'w');
              push_val(name,*(mir_long *)(pbVar4 + 0x30));
              uVar10 = *(ulong *)(pbVar4 + 0x30);
              do {
                VARR_charpush(name,(byte)(uVar10 % 10) | 0x30);
                bVar5 = 9 < uVar10;
                uVar10 = uVar10 / 10;
              } while (bVar5);
            }
          }
          paVar11 = (anon_union_16_10_0af5b411_for_u *)&(pnVar2->op_link).next;
        }
      }
      obj = 0x65;
      goto LAB_0017773e;
    case TM_ARR:
      VARR_charpush(name,'A');
      paVar12 = (anon_union_8_5_3fbb1736_for_u *)&((type->u).ptr_type)->arr_type;
      break;
    case TM_FUNC:
      VARR_charpush(name,'F');
      get_type_alias_name(c2m_ctx,((type->u).ptr_type)->arr_type,name);
      paVar11 = &((((type->u).tag_type)->op_link).prev)->u;
      while (pnVar8 = (paVar11->ops).head, pnVar8 != (node_t_conflict)0x0) {
        pdVar9 = get_param_decl_spec(pnVar8);
        get_type_alias_name(c2m_ctx,pdVar9->type,name);
        paVar11 = (anon_union_16_10_0af5b411_for_u *)&(pnVar8->op_link).next;
      }
      obj = ((((type->u).tag_type)->code & N_I) == N_IGNORE) << 5 | 0x45;
      goto LAB_0017773e;
    default:
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x28a7,"void get_type_alias_name(c2m_ctx_t, struct type *, VARR_char *)");
    }
    type = paVar12->ptr_type;
  } while( true );
}

Assistant:

static void get_type_alias_name (c2m_ctx_t c2m_ctx, struct type *type, VARR (char) * name) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  enum basic_type basic_type;
  size_t i;

  switch (type->mode) {
  case TM_ENUM: basic_type = get_enum_basic_type (type); goto basic;
  case TM_BASIC:
    basic_type = type->u.basic_type;
  basic:
    switch (basic_type) {
    case TP_VOID: VARR_PUSH (char, name, 'v'); break;
    case TP_BOOL: VARR_PUSH (char, name, 'b'); break;
    case TP_CHAR:
    case TP_SCHAR:
    case TP_UCHAR: VARR_PUSH (char, name, 'c'); break;
    case TP_SHORT:
    case TP_USHORT: VARR_PUSH (char, name, 's'); break;
    case TP_INT:
    case TP_UINT: VARR_PUSH (char, name, 'i'); break;
    case TP_LONG:
    case TP_ULONG: VARR_PUSH (char, name, 'l'); break;
    case TP_LLONG:
    case TP_ULLONG: VARR_PUSH (char, name, 'L'); break;
    case TP_FLOAT: VARR_PUSH (char, name, 'f'); break;
    case TP_DOUBLE: VARR_PUSH (char, name, 'd'); break;
    case TP_LDOUBLE: VARR_PUSH (char, name, 'D'); break;
    default: assert (FALSE);
    }
    break;
  case TM_PTR:
    VARR_PUSH (char, name, 'p');
    get_type_alias_name (c2m_ctx, type->u.ptr_type, name);
    break;
  case TM_STRUCT:
  case TM_UNION:
    VARR_PUSH (char, name, type->mode == TM_STRUCT ? 'S' : 'U');
    for (i = 0; i < VARR_LENGTH (node_t, node_stack); i++)
      if (VARR_GET (node_t, node_stack, i) == type->u.tag_type) break;
    if (i < VARR_LENGTH (node_t, node_stack)) {
      VARR_PUSH (char, name, 'r');
      push_val (name, (mir_long) i);
    } else {
      VARR_PUSH (node_t, node_stack, type->u.tag_type);
      for (node_t member = NL_HEAD (NL_EL (type->u.tag_type->u.ops, 1)->u.ops); member != NULL;
           member = NL_NEXT (member))
        if (member->code == N_MEMBER) {
          decl_t decl = member->attr;
          node_t width = NL_EL (member->u.ops, 3);
          struct expr *expr;

          get_type_alias_name (c2m_ctx, decl->decl_spec.type, name);
          if (width->code != N_IGNORE && (expr = width->attr)->const_p) {
            VARR_PUSH (char, name, 'w');
            push_val (name, (mir_long) expr->c.u_val);
            for (mir_ullong v = expr->c.u_val;;) {
              VARR_PUSH (char, name, v % 10 + '0');
              v /= 10;
              if (v == 0) break;
            }
          }
        }
    }
    VARR_PUSH (char, name, 'e');
    break;
  case TM_ARR:
    VARR_PUSH (char, name, 'A');
    get_type_alias_name (c2m_ctx, type->u.arr_type->el_type, name);
    break;
  case TM_FUNC:
    VARR_PUSH (char, name, 'F');
    get_type_alias_name (c2m_ctx, type->u.func_type->ret_type, name);
    for (node_t p = NL_HEAD (type->u.func_type->param_list->u.ops); p != NULL; p = NL_NEXT (p)) {
      struct decl_spec *ds = get_param_decl_spec (p);
      get_type_alias_name (c2m_ctx, ds->type, name);
    }
    VARR_PUSH (char, name, type->u.func_type->dots_p ? 'E' : 'e');
    break;
  default: assert (FALSE);
  }
}